

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall VmaJsonWriter::EndString(VmaJsonWriter *this,char *pStr)

{
  if ((pStr != (char *)0x0) && (*pStr != '\0')) {
    ContinueString(this,pStr);
  }
  VmaStringBuilder::Add(this->m_SB,'\"');
  this->m_InsideString = false;
  return;
}

Assistant:

void VmaJsonWriter::EndString(const char* pStr)
{
    VMA_ASSERT(m_InsideString);
    if (pStr != VMA_NULL && pStr[0] != '\0')
    {
        ContinueString(pStr);
    }
    m_SB.Add('"');
    m_InsideString = false;
}